

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_preserve_unknown_enum.pb.cc
# Opt level: O3

void proto3_preserve_unknown_enum_unittest::MyMessage::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  if (from_msg == to_msg) {
    MergeImpl();
  }
  google::protobuf::RepeatedField<int>::MergeFrom
            ((RepeatedField<int> *)&to_msg[1]._internal_metadata_,
             (RepeatedField<int> *)&from_msg[1]._internal_metadata_);
  google::protobuf::RepeatedField<int>::MergeFrom
            ((RepeatedField<int> *)(to_msg + 3),(RepeatedField<int> *)(from_msg + 3));
  google::protobuf::RepeatedField<int>::MergeFrom
            ((RepeatedField<int> *)&to_msg[4]._internal_metadata_,
             (RepeatedField<int> *)&from_msg[4]._internal_metadata_);
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if (((uVar1 & 1) != 0) &&
     (iVar2 = *(int *)((long)&from_msg[5]._internal_metadata_.ptr_ + 4), iVar2 != 0)) {
    *(int *)((long)&to_msg[5]._internal_metadata_.ptr_ + 4) = iVar2;
  }
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | uVar1;
  iVar2 = *(int *)((long)&from_msg[6]._vptr_MessageLite + 4);
  if (iVar2 != 0) {
    if (*(int *)((long)&to_msg[6]._vptr_MessageLite + 4) != iVar2) {
      *(int *)((long)&to_msg[6]._vptr_MessageLite + 4) = iVar2;
    }
    if (iVar2 - 5U < 2) {
      *(undefined4 *)&to_msg[6]._vptr_MessageLite = *(undefined4 *)&from_msg[6]._vptr_MessageLite;
    }
  }
  uVar3 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar3 & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar3 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void MyMessage::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<MyMessage*>(&to_msg);
  auto& from = static_cast<const MyMessage&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto3_preserve_unknown_enum_unittest.MyMessage)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_e()->MergeFrom(from._internal_repeated_e());
  _this->_internal_mutable_repeated_packed_e()->MergeFrom(from._internal_repeated_packed_e());
  _this->_internal_mutable_repeated_packed_unexpected_e()->MergeFrom(from._internal_repeated_packed_unexpected_e());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    if (from._internal_e() != 0) {
      _this->_impl_.e_ = from._impl_.e_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_o();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kOneofE1: {
        _this->_impl_.o_.oneof_e_1_ = from._impl_.o_.oneof_e_1_;
        break;
      }
      case kOneofE2: {
        _this->_impl_.o_.oneof_e_2_ = from._impl_.o_.oneof_e_2_;
        break;
      }
      case O_NOT_SET:
        break;
    }
  }
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}